

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

QSize __thiscall QMainWindowLayout::minimumSize(QMainWindowLayout *this)

{
  bool bVar1;
  QMainWindowLayoutState *in_RDI;
  long in_FS_OFFSET;
  QSize sbMin;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  QSize *in_stack_ffffffffffffffb0;
  int local_30;
  int local_2c;
  undefined8 local_28;
  undefined1 *local_20;
  QSize local_18;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QSize::isValid((QSize *)in_RDI);
  if (!bVar1) {
    local_18 = QMainWindowLayoutState::minimumSize(in_RDI);
    *(QSize *)&in_RDI[2].toolBarAreaLayout.field_0xfc = local_18;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    if (*(long *)&in_RDI[2].toolBarAreaLayout.docks[1].dirty == 0) {
      QSize::QSize(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
    }
    else {
      local_20 = (undefined1 *)
                 (**(code **)(**(long **)&in_RDI[2].toolBarAreaLayout.docks[1].dirty + 0x18))();
    }
    local_2c = QSize::width((QSize *)0x5f961a);
    local_30 = QSize::width((QSize *)0x5f962f);
    qMax<int>(&local_2c,&local_30);
    QSize::height((QSize *)0x5f9652);
    QSize::height((QSize *)0x5f9667);
    QSize::QSize(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
    *(undefined8 *)&in_RDI[2].toolBarAreaLayout.field_0xfc = local_28;
  }
  local_10 = *(QSize *)&in_RDI[2].toolBarAreaLayout.field_0xfc;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

QSize QMainWindowLayout::minimumSize() const
{
    if (!minSize.isValid()) {
        minSize = layoutState.minimumSize();
        const QSize sbMin = statusbar ? statusbar->minimumSize() : QSize(0, 0);
        minSize = QSize(qMax(sbMin.width(), minSize.width()),
                        sbMin.height() + minSize.height());
    }
    return minSize;
}